

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

void __thiscall L12_1::String::String(String *this,String *s)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  String *s_local;
  String *this_local;
  
  iVar1 = length(s);
  this->_length = iVar1;
  uVar3 = (ulong)(this->_length + 1);
  if ((long)uVar3 < 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pcVar2 = (char *)operator_new__(uVar3);
  this->_p_str = pcVar2;
  strcpy(this->_p_str,s->_p_str);
  std::operator<<((ostream *)&std::cout,"init from another String...");
  num_strings = num_strings + 1;
  return;
}

Assistant:

String::String(const String & s) {
        _length = s.length();
        _p_str = new char[_length + 1];
        std::strcpy(_p_str, s._p_str);

        std::cout << "init from another String...";
        num_strings++;
    }